

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_binbuf.c
# Opt level: O2

void binbuf_addbinbuf(_binbuf *x,_binbuf *y)

{
  bool bVar1;
  _binbuf *x_00;
  byte *pbVar2;
  t_symbol *ptVar3;
  uint uVar4;
  char *s;
  int iVar5;
  t_atom *a;
  char tbuf [1000];
  
  x_00 = binbuf_new();
  binbuf_add(x_00,y->b_n,y->b_vec);
  a = x_00->b_vec;
  iVar5 = 0;
LAB_001628f3:
  if (x_00->b_n <= iVar5) {
    binbuf_add(x,x_00->b_n,x_00->b_vec);
    binbuf_free(x_00);
    return;
  }
  switch(a->a_type) {
  case A_FLOAT:
    break;
  case A_SYMBOL:
    pbVar2 = (byte *)((a->a_w).w_symbol)->s_name;
    bVar1 = false;
    do {
      uVar4 = *pbVar2 - 0x24;
      if ((uVar4 < 0x39) && ((0x100000000800101U >> ((ulong)uVar4 & 0x3f) & 1) != 0)) {
        bVar1 = true;
      }
      else if (*pbVar2 == 0) goto code_r0x00162938;
      pbVar2 = pbVar2 + 1;
    } while( true );
  default:
    bug("binbuf_addbinbuf");
    break;
  case A_SEMI:
    a->a_type = A_SYMBOL;
    s = ";";
    goto LAB_001629ae;
  case A_COMMA:
    a->a_type = A_SYMBOL;
    s = ",";
    goto LAB_001629ae;
  case A_DOLLAR:
    sprintf(tbuf,"$%d",(ulong)(uint)(a->a_w).w_index);
    goto LAB_0016296d;
  case A_DOLLSYM:
    goto switchD_00162910_caseD_9;
  }
  goto switchD_00162910_caseD_1;
code_r0x00162938:
  if (bVar1) {
switchD_00162910_caseD_9:
    atom_string(a,tbuf,1000);
LAB_0016296d:
    s = tbuf;
    a->a_type = A_SYMBOL;
LAB_001629ae:
    ptVar3 = gensym(s);
    (a->a_w).w_symbol = ptVar3;
  }
switchD_00162910_caseD_1:
  iVar5 = iVar5 + 1;
  a = a + 1;
  goto LAB_001628f3;
}

Assistant:

void binbuf_addbinbuf(t_binbuf *x, const t_binbuf *y)
{
    t_binbuf *z = binbuf_new();
    int i, fixit;
    t_atom *ap;
    binbuf_add(z, y->b_n, y->b_vec);
    for (i = 0, ap = z->b_vec; i < z->b_n; i++, ap++)
    {
        char tbuf[MAXPDSTRING];
        const char *s;
        switch (ap->a_type)
        {
        case A_FLOAT:
            break;
        case A_SEMI:
            SETSYMBOL(ap, gensym(";"));
            break;
        case A_COMMA:
            SETSYMBOL(ap, gensym(","));
            break;
        case A_DOLLAR:
            sprintf(tbuf, "$%d", ap->a_w.w_index);
            SETSYMBOL(ap, gensym(tbuf));
            break;
        case A_DOLLSYM:
            atom_string(ap, tbuf, MAXPDSTRING);
            SETSYMBOL(ap, gensym(tbuf));
            break;
        case A_SYMBOL:
            for (s = ap->a_w.w_symbol->s_name, fixit = 0; *s; s++)
                if (*s == ';' || *s == ',' || *s == '$' || *s == '\\')
                    fixit = 1;
            if (fixit)
            {
                atom_string(ap, tbuf, MAXPDSTRING);
                SETSYMBOL(ap, gensym(tbuf));
            }
            break;
        default:
            bug("binbuf_addbinbuf");
        }
    }

    binbuf_add(x, z->b_n, z->b_vec);
    binbuf_free(z);
}